

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

error_or<int> * __thiscall
pstore::http::close_message<WsServer_Ping_Test::TestBody()::__2,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_65350a3f sender,int io,
          frame *wsp)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_00;
  bool bVar1;
  uint16_t *puVar2;
  const_iterator last;
  undefined4 in_register_0000000c;
  long lVar3;
  close_status_code status;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  const_iterator first;
  size_type payload_size;
  close_status_code state;
  frame *wsp_local;
  int io_local;
  anon_class_8_1_65350a3f sender_local;
  
  status = (close_status_code)wsp;
  lVar3 = CONCAT44(in_register_0000000c,io);
  first._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar3 + 8));
  if (first._M_current == (uchar *)0x0) {
    payload_size._6_2_ = 1000;
  }
  else if (first._M_current < (uchar *)0x2) {
    payload_size._6_2_ = 0x3ea;
  }
  else {
    if (first._M_current < (uchar *)0x2) {
      assert_failed("payload_size >= sizeof (std::uint16_t)",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                    ,0x1a8);
    }
    puVar2 = (uint16_t *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar3 + 8));
    payload_size._6_2_ = network_to_host<unsigned_short>(*puVar2);
    bVar1 = is_valid_close_status_code(payload_size._6_2_);
    if (bVar1) {
      if ((uchar *)0x2 < first._M_current) {
        local_40._M_current =
             (uchar *)std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 (lVar3 + 8));
        std::
        advance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_long>
                  (&local_40,2);
        first_00._M_current = local_40._M_current;
        last = std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar3 + 8));
        bVar1 = is_valid_utf8<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (first_00,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     )last._M_current);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          payload_size._6_2_ = 0x3ef;
        }
      }
    }
    else {
      payload_size._6_2_ = 0x3ea;
    }
  }
  send_close_frame<WsServer_Ping_Test::TestBody()::__2,int>
            (__return_storage_ptr__,this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((ulong)sender.output & 0xffffffff),(uint)payload_size._6_2_,status);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> close_message (Sender const sender, IO const io, frame const & wsp) {
            auto state = close_status_code::normal;
            auto const payload_size = wsp.payload.size ();

            // "If there is a body, the first two bytes of the body MUST be a 2-byte unsigned
            // integer (in network byte order) representing a status code with value /code/ defined
            // in Section 7.4. Following the 2-byte integer, the body MAY contain UTF-8-encoded data
            // with value /reason/, the interpretation of which is not defined by this
            // specification."
            if (payload_size == 0U) {
                // That's fine. Just a normal close.
                state = close_status_code::normal;
            } else if (payload_size < sizeof (std::uint16_t)) {
                // Bad message. Payload must be 0 or at least a 2 byte close-code.
                state = close_status_code::protocol_error;
            } else {
                // Extract the close state from the message payload.
                PSTORE_ASSERT (payload_size >= sizeof (std::uint16_t));
                state = static_cast<close_status_code> (network_to_host (
                    *reinterpret_cast<std::uint16_t const *> (wsp.payload.data ())));

                if (!is_valid_close_status_code (static_cast<std::uint16_t> (state))) {
                    state = close_status_code::protocol_error;
                } else if (payload_size > sizeof (std::uint16_t)) {
                    auto first = std::begin (wsp.payload);
                    std::advance (first, sizeof (std::uint16_t));
                    if (!is_valid_utf8 (first, std::end (wsp.payload))) {
                        state = close_status_code::invalid_payload;
                    }
                }
            }

            return send_close_frame (sender, io, state);
        }